

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osnoui.c
# Opt level: O3

void os_defext(char *fn,char *ext)

{
  char *pcVar1;
  size_t sVar2;
  char *pcVar3;
  
  sVar2 = strlen(fn);
  pcVar3 = fn + sVar2;
  do {
    if (pcVar3 <= fn) break;
    pcVar1 = pcVar3 + -1;
    if (*pcVar1 == '.') {
      return;
    }
    pcVar3 = pcVar3 + -1;
  } while (*pcVar1 != '/');
  sVar2 = strlen(fn);
  (fn + sVar2)[0] = '.';
  (fn + sVar2)[1] = '\0';
  strcat(fn,ext);
  return;
}

Assistant:

void os_defext(char *fn, const char *ext)
{
    char *p;

    /* 
     *   Scan backwards from the end of the string, looking for the last
     *   dot ('.') in the filename.  Stop if we encounter a path separator
     *   character of some kind, because that means we reached the start
     *   of the filename without encountering a period.  
     */
    p = fn + strlen(fn);
    while (p > fn)
    {
        /* on to the previous character */
        p--;

        /* 
         *   if it's a period, return without doing anything - this
         *   filename already has an extension, so don't apply a default 
         */
        if (*p == '.')
            return;

        /* 
         *   if this is a path separator character, we're no longer in the
         *   filename, so stop looking for a period 
         */
        if (ispathchar(*p))
            break;
    }

    /* we didn't find an extension - add the dot and the extension */
    strcat(fn, ".");
    strcat(fn, ext);
}